

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_33804::
ARTCorrectnessTest_InsertToFullNode4_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_InsertToFullNode4_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  key_view start_key;
  initializer_list<int> absent_keys;
  undefined1 local_118 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  node_type_counter_array local_38;
  
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_118,false);
  start_key = unodb::test::
              tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::make_key((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                          *)local_118,0);
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_key_range_internal
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,start_key,4,false);
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118);
  local_38._M_elems[0] = 0x400000005;
  absent_keys._M_len = 2;
  absent_keys._M_array = (iterator)&local_38;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,absent_keys);
  local_38._M_elems[0] = 4;
  local_38._M_elems[1] = 1;
  local_38._M_elems[2] = 0;
  local_38._M_elems[3] = 0;
  local_38._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,&local_38);
  local_38._M_elems[0] = 1;
  local_38._M_elems[1] = 0;
  local_38._M_elems[2] = 0;
  local_38._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_growing_inodes
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,(inode_type_counter_array *)&local_38);
  if (verifier.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.values);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~db((db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *)&verifier.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, InsertToFullNode4) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(0, 4);

  verifier.check_present_values();
  verifier.check_absent_keys({5, 4});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({4, 1, 0, 0, 0});
  verifier.assert_growing_inodes({1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}